

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmParseFileScope::cmParseFileScope(cmParseFileScope *this,cmMakefile *mf)

{
  value_type local_20;
  cmMakefile *local_18;
  cmMakefile *mf_local;
  cmParseFileScope *this_local;
  
  this->Makefile = mf;
  local_18 = mf;
  mf_local = (cmMakefile *)this;
  cmCommandContext::cmCommandContext(&this->Context);
  local_20 = &this->Context;
  std::vector<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>::push_back
            (&this->Makefile->ContextStack,&local_20);
  return;
}

Assistant:

cmParseFileScope(cmMakefile* mf)
    : Makefile(mf)
  {
    this->Makefile->ContextStack.push_back(&this->Context);
  }